

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O0

Expression *
slang::ast::ConversionExpression::makeImplicit
          (ASTContext *context,Type *targetType,ConversionKind conversionKind,Expression *expr,
          Expression *parentExpr,SourceRange operatorRange)

{
  bool bVar1;
  ConversionExpression *pCVar2;
  ASTContext *in_RCX;
  int in_EDX;
  Expression **in_R8;
  ConversionExpression *result;
  Expression *op;
  Compilation *comp;
  Expression *in_stack_00000090;
  Expression *in_stack_00000098;
  Type *in_stack_000000a0;
  Type *in_stack_000000a8;
  ASTContext *in_stack_000000b0;
  undefined1 in_stack_000000c0 [16];
  ASTContext *in_stack_ffffffffffffff90;
  SourceRange *in_stack_ffffffffffffffa0;
  Expression *args_2;
  ConversionKind *in_stack_ffffffffffffffb0;
  Type *in_stack_ffffffffffffffb8;
  BumpAllocator *in_stack_ffffffffffffffc0;
  
  args_2 = (Expression *)&stack0x00000008;
  ASTContext::getCompilation((ASTContext *)0x98e023);
  Expression::selfDetermined(in_RCX,in_R8);
  pCVar2 = BumpAllocator::
           emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind&,slang::ast::Expression&,slang::SourceRange&>
                     (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                      args_2,in_stack_ffffffffffffffa0);
  (pCVar2->implicitOpRange).startLoc = *(SourceLocation *)args_2;
  (pCVar2->implicitOpRange).endLoc = (SourceLocation)(args_2->type).ptr;
  if ((in_EDX == 0) || (in_EDX == 1)) {
    bVar1 = ASTContext::inUnevaluatedBranch(in_stack_ffffffffffffff90);
    if (!bVar1) {
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x98e0b7);
      checkImplicitConversions
                (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
                 in_stack_00000090,(SourceRange)in_stack_000000c0,operatorRange.endLoc._4_4_);
    }
  }
  return &pCVar2->super_Expression;
}

Assistant:

Expression& ConversionExpression::makeImplicit(const ASTContext& context, const Type& targetType,
                                               ConversionKind conversionKind, Expression& expr,
                                               const Expression* parentExpr,
                                               SourceRange operatorRange) {
    auto& comp = context.getCompilation();
    SLANG_ASSERT(expr.isImplicitlyAssignableTo(comp, targetType));

    Expression* op = &expr;
    selfDetermined(context, op);

    auto result = comp.emplace<ConversionExpression>(targetType, conversionKind, *op,
                                                     op->sourceRange);
    result->implicitOpRange = operatorRange;

    if ((conversionKind == ConversionKind::Implicit ||
         conversionKind == ConversionKind::Propagated) &&
        !context.inUnevaluatedBranch()) {
        checkImplicitConversions(context, *op->type, targetType, *result, parentExpr, operatorRange,
                                 conversionKind);
    }

    return *result;
}